

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

string * __thiscall
CLI::App::get_display_name_abi_cxx11_(string *__return_storage_ptr__,App *this,bool with_aliases)

{
  bool bVar1;
  string *__rhs;
  reference __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lalias;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_19;
  App *pAStack_18;
  bool with_aliases_local;
  App *this_local;
  string *dispname;
  
  local_19 = with_aliases;
  pAStack_18 = this;
  this_local = (App *)__return_storage_ptr__;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->name_);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"[Option Group: ",&local_61);
    __rhs = get_group_abi_cxx11_(this);
    ::std::operator+(&local_40,&local_60,__rhs);
    ::std::operator+(__return_storage_ptr__,&local_40,"]");
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::allocator<char>::~allocator(&local_61);
  }
  else {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->aliases_);
    if ((bVar1) || ((local_19 & 1) == 0)) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,&this->name_);
    }
    else {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,&this->name_);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->aliases_);
      lalias = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->aliases_);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&lalias), ((bVar1 ^ 0xffU) & 1) != 0) {
        __str = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,',');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,' ');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,__str);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_display_name(bool with_aliases = false) const {
        if(name_.empty()) {
            return std::string("[Option Group: ") + get_group() + "]";
        }
        if(aliases_.empty() || !with_aliases) {
            return name_;
        }
        std::string dispname = name_;
        for(const auto &lalias : aliases_) {
            dispname.push_back(',');
            dispname.push_back(' ');
            dispname.append(lalias);
        }
        return dispname;
    }